

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O3

void Aig_ObjPrint(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (pObj == (Aig_Obj_t *)0x0) {
    pcVar3 = "Object is NULL.";
    goto LAB_006c969c;
  }
  if (((ulong)pObj & 1) != 0) {
    printf("Compl ");
    pObj = (Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x14a,"void Aig_ObjPrint(Aig_Man_t *, Aig_Obj_t *)");
  }
  printf("Node %4d : ",(ulong)(uint)pObj->Id);
  switch((uint)*(undefined8 *)&pObj->field_0x18 & 7) {
  case 1:
    pcVar3 = "constant 1";
    break;
  case 2:
    pcVar3 = "PI";
    break;
  case 3:
    uVar1 = *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24);
    pcVar3 = "\'";
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      pcVar3 = " ";
    }
    pcVar4 = "PO( %4d%s )";
    goto LAB_006c9594;
  case 4:
    uVar1 = *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24);
    pcVar3 = "\'";
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      pcVar3 = " ";
    }
    pcVar4 = "BUF( %d%s )";
LAB_006c9594:
    printf(pcVar4,(ulong)uVar1,pcVar3);
    goto LAB_006c95f6;
  default:
    pcVar4 = "\'";
    pcVar3 = "\'";
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      pcVar3 = " ";
    }
    if (((ulong)pObj->pFanin1 & 1) == 0) {
      pcVar4 = " ";
    }
    printf("AND( %4d%s, %4d%s )",
           (ulong)*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24),pcVar3,
           (ulong)*(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x24),pcVar4);
    goto LAB_006c95f6;
  }
  printf(pcVar3);
LAB_006c95f6:
  printf(" (refs = %3d)",(ulong)(*(uint *)&pObj->field_0x18 >> 6));
  if ((p->pEquivs == (Aig_Obj_t **)0x0) || (p->pEquivs[pObj->Id] == (Aig_Obj_t *)0x0)) {
    if ((p->pReprs != (Aig_Obj_t **)0x0) && (p->pReprs[pObj->Id] != (Aig_Obj_t *)0x0)) {
      printf("  class of %d");
      return;
    }
    return;
  }
  printf("  { %4d ");
  for (pAVar2 = p->pEquivs[pObj->Id]; pAVar2 != (Aig_Obj_t *)0x0; pAVar2 = p->pEquivs[pAVar2->Id]) {
    pcVar3 = "\'";
    if (((*(uint *)&pObj->field_0x18 ^ *(uint *)&pAVar2->field_0x18) & 8) == 0) {
      pcVar3 = " ";
    }
    printf(" %4d%s",(ulong)(uint)pAVar2->Id,pcVar3);
  }
  pcVar3 = " }";
LAB_006c969c:
  printf(pcVar3);
  return;
}

Assistant:

void Aig_ObjPrint( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    int fShowFanouts = 0;
    Aig_Obj_t * pTemp;
    if ( pObj == NULL )
    {
        printf( "Object is NULL." );
        return;
    }
    if ( Aig_IsComplement(pObj) )
    {
        printf( "Compl " );
        pObj = Aig_Not(pObj);
    }
    assert( !Aig_IsComplement(pObj) );
    printf( "Node %4d : ", Aig_ObjId(pObj) );
    if ( Aig_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( Aig_ObjIsCi(pObj) )
        printf( "PI" );
    else if ( Aig_ObjIsCo(pObj) )
        printf( "PO( %4d%s )", Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Aig_ObjIsBuf(pObj) )
        printf( "BUF( %d%s )", Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " ") );
    else
        printf( "AND( %4d%s, %4d%s )", 
            Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " "), 
            Aig_ObjFanin1(pObj)->Id, (Aig_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", Aig_ObjRefs(pObj) );
    if ( fShowFanouts && p->pFanData )
    {
        Aig_Obj_t * pFanout;
        int i;
        int iFan = -1; // Suppress "might be used uninitialized"
        printf( "\nFanouts:\n" );
        Aig_ObjForEachFanout( p, pObj, pFanout, iFan, i )
        {
            printf( "    " );
            printf( "Node %4d : ", Aig_ObjId(pFanout) );
            if ( Aig_ObjIsCo(pFanout) )
                printf( "PO( %4d%s )", Aig_ObjFanin0(pFanout)->Id, (Aig_ObjFaninC0(pFanout)? "\'" : " ") );
            else if ( Aig_ObjIsBuf(pFanout) )
                printf( "BUF( %d%s )", Aig_ObjFanin0(pFanout)->Id, (Aig_ObjFaninC0(pFanout)? "\'" : " ") );
            else
                printf( "AND( %4d%s, %4d%s )", 
                    Aig_ObjFanin0(pFanout)->Id, (Aig_ObjFaninC0(pFanout)? "\'" : " "), 
                    Aig_ObjFanin1(pFanout)->Id, (Aig_ObjFaninC1(pFanout)? "\'" : " ") );
            printf( "\n" );
        }
        return;
    }
    // there are choices
    if ( p->pEquivs && p->pEquivs[pObj->Id] )
    {
        // print equivalence class
        printf( "  { %4d ", pObj->Id );
        for ( pTemp = p->pEquivs[pObj->Id]; pTemp; pTemp = p->pEquivs[pTemp->Id] )
            printf( " %4d%s", pTemp->Id, (pTemp->fPhase != pObj->fPhase)? "\'" : " " );
        printf( " }" );
        return;
    }
    // this is a secondary node
    if ( p->pReprs && p->pReprs[pObj->Id] )
        printf( "  class of %d", pObj->Id );
}